

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.cpp
# Opt level: O0

void __thiscall Task::Task(Task *this,curl_off_t start,curl_off_t end,short status)

{
  thread local_60;
  proxy local_58;
  short local_22;
  curl_off_t cStack_20;
  short status_local;
  curl_off_t end_local;
  curl_off_t start_local;
  Task *this_local;
  
  local_22 = status;
  cStack_20 = end;
  end_local = start;
  start_local = (curl_off_t)this;
  proxy::proxy(&this->proxy_server);
  std::thread::thread(&this->taskThread);
  this->task_id = global_task_id;
  global_task_id = global_task_id + 1;
  memset(&local_58,0,0x30);
  proxy::proxy(&local_58);
  proxy::operator=(&this->proxy_server,&local_58);
  proxy::~proxy(&local_58);
  this->start = end_local;
  this->end = cStack_20;
  this->download = 0;
  this->status = local_22;
  this->speed = 0;
  memset(&local_60,0,8);
  std::thread::thread(&local_60);
  std::thread::operator=(&this->taskThread,&local_60);
  std::thread::~thread(&local_60);
  return;
}

Assistant:

Task::Task(curl_off_t start, curl_off_t end, short status) {
    this->task_id = global_task_id;
    global_task_id++;
    this->proxy_server = proxy();
    this->start = start;
    this->end = end;
    download = 0;
    this->status = status;
    speed = 0;
    this->taskThread = thread();
}